

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O1

void r3d::clip<3>(Polytope<3> *poly,Plane<3> *planes,Int nplanes)

{
  Vector<3> *pVVar1;
  Plane<3> *pPVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  double dVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  double *pdVar13;
  Polytope<3> *pPVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  Vector<3> *pVVar18;
  long lVar19;
  Int i_2;
  uint uVar20;
  Vertex<3> *pVVar21;
  Int i_1;
  ulong uVar22;
  double dVar23;
  double dVar24;
  Vector<3> vr;
  Int clipped [128];
  Real sdists [128];
  UninitT local_6d8 [4];
  UninitT local_6b8;
  UninitT aUStack_6b0 [3];
  double local_698;
  double dStack_690;
  UninitT local_688;
  UninitT local_678 [4];
  double local_658 [4];
  int local_638 [128];
  double adStack_438 [129];
  
  if ((0 < poly->nverts) && (0 < nplanes)) {
    pVVar1 = &poly->verts[0].pos;
    uVar16 = 0;
    do {
      iVar11 = poly->nverts;
      uVar22 = (ulong)iVar11;
      bVar7 = false;
      memset(local_638,0,0x200);
      if ((long)uVar22 < 1) {
        bVar8 = false;
      }
      else {
        pPVar2 = planes + uVar16;
        dVar3 = planes[uVar16].d;
        uVar12 = 0;
        dVar23 = 1.79769313486232e+308;
        dVar4 = -1.79769313486232e+308;
        do {
          local_688 = poly->verts[uVar12].pos.super_Few<double,_3>.array_[2];
          pdVar13 = (double *)((long)pVVar1 + uVar12 * 0x28);
          local_698 = *pdVar13;
          dStack_690 = pdVar13[1];
          local_6b8 = (pPVar2->n).super_Few<double,_3>.array_[0];
          aUStack_6b0[0] = (pPVar2->n).super_Few<double,_3>.array_[1];
          aUStack_6b0[1] = (pPVar2->n).super_Few<double,_3>.array_[2];
          dVar9 = local_698 * (double)local_6b8;
          lVar15 = 0;
          do {
            dVar9 = dVar9 + (&dStack_690)[lVar15] * (double)aUStack_6b0[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 2);
          dVar9 = dVar9 + dVar3;
          adStack_438[uVar12] = dVar9;
          if (dVar9 < 0.0) {
            local_638[uVar12] = 1;
          }
          dVar24 = dVar9;
          if (dVar23 <= dVar9) {
            dVar24 = dVar23;
          }
          if (dVar9 <= dVar4) {
            dVar9 = dVar4;
          }
          uVar12 = uVar12 + 1;
          dVar23 = dVar24;
          dVar4 = dVar9;
        } while (uVar12 != uVar22);
        bVar7 = dVar24 < 0.0;
        bVar8 = 0.0 < dVar9;
      }
      bVar10 = false;
      if (bVar7) {
        if (bVar8) {
          if (0 < iVar11) {
            uVar12 = 0;
            do {
              if (local_638[uVar12] == 0) {
                pdVar13 = (double *)(uVar12 * 0x28 + (long)pVVar1);
                lVar15 = 0;
                do {
                  iVar5 = poly->verts[uVar12].pnbrs[lVar15];
                  if (local_638[iVar5] != 0) {
                    poly->verts[poly->nverts].pnbrs[0] = (Int)uVar12;
                    poly->verts[uVar12].pnbrs[lVar15] = poly->nverts;
                    local_658[0] = *pdVar13;
                    local_658[1] = pdVar13[1];
                    local_658[2] = pdVar13[2];
                    dVar3 = adStack_438[iVar5];
                    pVVar18 = &poly->verts[iVar5].pos;
                    local_678[0] = (pVVar18->super_Few<double,_3>).array_[0];
                    local_678[1] = (pVVar18->super_Few<double,_3>).array_[1];
                    local_678[2] = poly->verts[iVar5].pos.super_Few<double,_3>.array_[2];
                    dVar4 = adStack_438[uVar12];
                    local_6d8[0] = (UninitT)0x0;
                    local_6d8[1] = (UninitT)0x0;
                    local_6d8[2] = (UninitT)0x0;
                    lVar19 = 0;
                    do {
                      local_6d8[lVar19] =
                           (UninitT)((local_658[lVar19] * -dVar3 + (double)local_678[lVar19] * dVar4
                                     ) / (dVar4 - dVar3));
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 3);
                    iVar5 = poly->nverts;
                    lVar19 = 0;
                    do {
                      poly->verts[iVar5].pos.super_Few<double,_3>.array_[lVar19] = local_6d8[lVar19]
                      ;
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 3);
                    poly->nverts = iVar5 + 1;
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar22);
          }
          iVar5 = poly->nverts;
          if (iVar11 < iVar5) {
            do {
              uVar12 = uVar22 & 0xffffffff;
              pVVar21 = poly->verts + uVar22;
              do {
                iVar6 = pVVar21->pnbrs[0];
                uVar17 = (ulong)iVar6;
                uVar20 = 1;
                lVar15 = 0;
                do {
                  if (poly->verts[uVar17].pnbrs[lVar15] == (int)uVar12) {
                    uVar12 = (ulong)(uVar20 % 3);
                    goto LAB_00291295;
                  }
                  lVar15 = lVar15 + 1;
                  uVar20 = uVar20 + 1;
                } while (lVar15 != 3);
                uVar12 = 1;
LAB_00291295:
                pVVar21 = (Vertex<3> *)(poly->verts[uVar17].pnbrs + uVar12);
                uVar12 = uVar17;
              } while (iVar6 < iVar11);
              poly->verts[uVar22].pnbrs[2] = iVar6;
              poly->verts[uVar17].pnbrs[1] = (Int)uVar22;
              uVar22 = uVar22 + 1;
            } while (uVar22 != (long)iVar5);
          }
          bVar10 = false;
          iVar11 = 0;
          if (0 < poly->nverts) {
            lVar15 = 0;
            iVar11 = 0;
            pVVar18 = pVVar1;
            do {
              if (local_638[lVar15] == 0) {
                pVVar21 = poly->verts + iVar11;
                pVVar21->pnbrs[2] = poly->verts[lVar15].pnbrs[2];
                *(undefined8 *)pVVar21->pnbrs = *(undefined8 *)poly->verts[lVar15].pnbrs;
                lVar19 = 0;
                do {
                  (pVVar21->pos).super_Few<double,_3>.array_[lVar19] =
                       (pVVar18->super_Few<double,_3>).array_[lVar19];
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_638[lVar15] = iVar11;
                iVar11 = iVar11 + 1;
              }
              lVar15 = lVar15 + 1;
              pVVar18 = (Vector<3> *)((long)(pVVar18 + 1) + 0x10);
            } while (lVar15 < poly->nverts);
          }
          poly->nverts = iVar11;
          if (0 < iVar11) {
            lVar15 = 0;
            pPVar14 = poly;
            do {
              lVar19 = 0;
              do {
                pPVar14->verts[0].pnbrs[lVar19] = local_638[pPVar14->verts[0].pnbrs[lVar19]];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              lVar15 = lVar15 + 1;
              pPVar14 = (Polytope<3> *)(pPVar14->verts + 1);
            } while (lVar15 < poly->nverts);
          }
        }
        else {
          poly->nverts = 0;
          bVar10 = true;
        }
      }
    } while ((!bVar10) && (uVar16 = uVar16 + 1, uVar16 != (uint)nplanes));
  }
  return;
}

Assistant:

R3D_INLINE void clip(
    Polytope<dim>& poly, Plane<dim> const* planes, Int nplanes) {
  if (poly.nverts <= 0) return;

  // variable declarations
  Int v, p, np, onv, vcur, vnext, numunclipped;

  // signed distances to the clipping plane
  Real sdists[Polytope<dim>::max_verts];
  Real smin, smax;

  // loop over each clip plane
  for (p = 0; p < nplanes; ++p) {
    // calculate signed distances to the clip plane
    onv = poly.nverts;
    smin = ArithTraits<Real>::max();
    smax = ArithTraits<Real>::min();

    // for marking clipped vertices
    Int clipped[MaxVerts<dim>::value] = {};  // all initialized to zero
    for (v = 0; v < onv; ++v) {
      sdists[v] = planes[p].d + (poly.verts[v].pos * planes[p].n);
      if (sdists[v] < smin) smin = sdists[v];
      if (sdists[v] > smax) smax = sdists[v];
      if (sdists[v] < 0.0) clipped[v] = 1;
    }

    // skip this face if the poly lies entirely on one side of it
    if (smin >= 0.0) continue;
    if (smax <= 0.0) {
      poly.nverts = 0;
      return;
    }

    // check all edges and insert new vertices on the bisected edges
    for (vcur = 0; vcur < onv; ++vcur) {
      if (clipped[vcur]) continue;
      for (np = 0; np < dim; ++np) {
        vnext = poly.verts[vcur].pnbrs[np];
        if (!clipped[vnext]) continue;
        ClipHelper<dim>::init_new_vert_link(poly, vcur, np);
        poly.verts[vcur].pnbrs[np] = poly.nverts;
        poly.verts[poly.nverts].pos = wav(poly.verts[vcur].pos, -sdists[vnext],
            poly.verts[vnext].pos, sdists[vcur]);
        ++(poly.nverts);
      }
    }

    // for each new vert, search around the poly for its new neighbors
    // and doubly-link everything
    ClipHelper<dim>::finalize_links(onv, poly);

    // go through and compress the vertex list, removing clipped verts
    // and re-indexing accordingly (reusing `clipped` to re-index everything)
    numunclipped = 0;
    for (v = 0; v < poly.nverts; ++v) {
      if (!clipped[v]) {
        poly.verts[numunclipped] = poly.verts[v];
        clipped[v] = numunclipped++;
      }
    }
    poly.nverts = numunclipped;
    for (v = 0; v < poly.nverts; ++v)
      for (np = 0; np < dim; ++np)
        poly.verts[v].pnbrs[np] = clipped[poly.verts[v].pnbrs[np]];
  }
}